

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O1

void SkipMatchesSpec(UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                    size_t _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  UInt32 *pUVar9;
  uint uVar10;
  UInt32 *local_50;
  UInt32 *local_48;
  
  local_48 = son + _cyclicBufferPos * 2;
  local_50 = son + _cyclicBufferPos * 2 + 1;
  uVar3 = pos - _cyclicBufferSize;
  if (pos < _cyclicBufferSize) {
    uVar3 = 0;
  }
  if (uVar3 < curMatch) {
    uVar10 = 0;
    uVar8 = 0;
    do {
      uVar2 = (ulong)(pos - curMatch);
      uVar6 = 0;
      if (_cyclicBufferPos < uVar2) {
        uVar6 = (ulong)_cyclicBufferSize;
      }
      uVar5 = uVar8;
      if (uVar10 < uVar8) {
        uVar5 = uVar10;
      }
      uVar7 = (ulong)uVar5;
      pUVar9 = son + ((_cyclicBufferPos - uVar2) + uVar6) * 2;
      if (cur[uVar7 - uVar2] == cur[uVar7]) {
        do {
          iVar4 = (int)uVar7;
          if (lenLimit - 1 == iVar4) goto LAB_001969aa;
          uVar5 = iVar4 + 1;
          uVar7 = (ulong)uVar5;
        } while (cur[uVar5 - uVar2] == cur[uVar5]);
        if (lenLimit - 1 != iVar4) goto LAB_001969c4;
LAB_001969aa:
        *local_48 = *pUVar9;
        *local_50 = pUVar9[1];
        bVar1 = false;
      }
      else {
LAB_001969c4:
        if (cur[uVar7 - uVar2] < cur[uVar7]) {
          *local_48 = curMatch;
          pUVar9 = pUVar9 + 1;
          uVar8 = (uint)uVar7;
          local_48 = pUVar9;
        }
        else {
          *local_50 = curMatch;
          uVar10 = (uint)uVar7;
          local_50 = pUVar9;
        }
        curMatch = *pUVar9;
        bVar1 = true;
      }
      if (!bVar1) {
        return;
      }
      cutValue = cutValue - 1;
    } while ((cutValue != 0) && (uVar3 < curMatch));
  }
  *local_48 = 0;
  *local_50 = 0;
  return;
}

Assistant:

static void SkipMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte *cur, CLzRef *son,
    size_t _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue)
{
  CLzRef *ptr0 = son + ((size_t)_cyclicBufferPos << 1) + 1;
  CLzRef *ptr1 = son + ((size_t)_cyclicBufferPos << 1);
  unsigned len0 = 0, len1 = 0;

  UInt32 cmCheck;

  cmCheck = (UInt32)(pos - _cyclicBufferSize);
  if ((UInt32)pos <= _cyclicBufferSize)
    cmCheck = 0;

  if (// curMatch >= pos ||  // failure
      cmCheck < curMatch)
  do
  {
    const UInt32 delta = pos - curMatch;
    {
      CLzRef *pair = son + ((size_t)(_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte *pb = cur - delta;
      unsigned len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len])
      {
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        {
          if (len == lenLimit)
          {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return;
          }
        }
      }
      if (pb[len] < cur[len])
      {
        *ptr1 = curMatch;
        curMatch = pair[1];
        ptr1 = pair + 1;
        len1 = len;
      }
      else
      {
        *ptr0 = curMatch;
        curMatch = pair[0];
        ptr0 = pair;
        len0 = len;
      }
    }
  }
  while(--cutValue && cmCheck < curMatch);
  
  *ptr0 = *ptr1 = kEmptyHashValue;
  return;
}